

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

void enqueue(int **q,int e)

{
  int iVar1;
  int *piVar2;
  int _qsize;
  int e_local;
  int **q_local;
  
  if (**q == (*q)[1]) {
    iVar1 = (**q + 1) * 2;
    piVar2 = (int *)realloc(*q,(long)iVar1 << 2);
    *q = piVar2;
    **q = iVar1;
  }
  piVar2 = *q;
  iVar1 = (*q)[1];
  (*q)[1] = iVar1 + 1;
  piVar2[iVar1] = e;
  return;
}

Assistant:

static inline void enqueue(int **q, int e)
{
  int _qsize;
  if ((*q)[0]==(*q)[1]) { 
    _qsize=2*((*q)[0]+1);
    (*q)=(int*)realloc((*q), _qsize*sizeof(int));
    (*q)[0]=_qsize;
  }
  (*q)[(*q)[1]++]=e;
}